

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O1

void __thiscall
helics::FunctionExecutionFailure::~FunctionExecutionFailure(FunctionExecutionFailure *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_HelicsException = &PTR__HelicsException_00555830;
  pcVar2 = (this->super_HelicsException).errorMessage._M_dataplus._M_p;
  paVar1 = &(this->super_HelicsException).errorMessage.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit FunctionExecutionFailure(
        std::string_view message = "HELICS execution failure") noexcept: HelicsException(message)
    {
    }